

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O3

void aec_get_rsi_8(aec_stream *strm)

{
  uchar *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  ulong uVar4;
  
  puVar1 = strm->next_in;
  uVar3 = strm->block_size * strm->rsi;
  if (0 < (int)uVar3) {
    puVar2 = strm->state->data_raw;
    uVar4 = 0;
    do {
      puVar2[uVar4] = (uint)puVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  strm->next_in = puVar1 + (int)uVar3;
  strm->avail_in = strm->avail_in - (long)(int)uVar3;
  return;
}

Assistant:

void aec_get_rsi_8(struct aec_stream *strm)
{
    int i;
    uint32_t *restrict out = strm->state->data_raw;
    unsigned const char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (i = 0; i < rsi; i++)
        out[i] = (uint32_t)in[i];

    strm->next_in += rsi;
    strm->avail_in -= rsi;
}